

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

void __thiscall
dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>::
matrix<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>
          (matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>
           *this,matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                 *m)

{
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined ***)(this + 0x18) = &PTR__memory_manager_stateless_kernel_1_001fa610;
  row_major_layout::layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::
  set_size((layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5> *)this,
           *(size_t *)(**(long **)m + 8),*(size_t *)(**(long **)m + 0x10));
  blas_bindings::
  matrix_assign_blas<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout,dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>
            ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
              *)this,(matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                      *)m);
  return;
}

Assistant:

matrix (
            const matrix_exp<EXP>& m
        )
        {
            // You get an error on this line if the matrix m contains a type that isn't
            // the same as the type contained in the target matrix.
            COMPILE_TIME_ASSERT((is_same_type<typename EXP::type,type>::value == true) ||
                                (is_matrix<typename EXP::type>::value == true));

            // The matrix you are trying to assign m to is a statically sized matrix and 
            // m's dimensions don't match that of *this. 
            COMPILE_TIME_ASSERT(EXP::NR == NR || NR == 0 || EXP::NR == 0);
            COMPILE_TIME_ASSERT(EXP::NC == NC || NC == 0 || EXP::NC == 0);
            DLIB_ASSERT((NR == 0 || NR == m.nr()) && (NC == 0 || NC == m.nc()), 
                "\tmatrix& matrix::matrix(const matrix_exp& m)"
                << "\n\tYou are trying to assign a dynamically sized matrix to a statically sized matrix with the wrong size"
                << "\n\tNR:     " << NR
                << "\n\tNC:     " << NC
                << "\n\tm.nr(): " << m.nr()
                << "\n\tm.nc(): " << m.nc()
                << "\n\tthis:   " << this
                );

            data.set_size(m.nr(),m.nc());

            matrix_assign(*this, m);
        }